

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_name_match.cc
# Opt level: O0

bool __thiscall
bssl::NormalizeName(bssl *this,Input name_rdn_sequence,string *normalized_rdn_sequence,
                   CertErrors *errors)

{
  vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_> *pvVar1;
  Input input;
  bool bVar2;
  int iVar3;
  cbb_st *pcVar4;
  reference this_00;
  uint8_t *puVar5;
  uint8_t *puVar6;
  size_t sVar7;
  undefined1 local_1c8 [8];
  string normalized_value;
  CBB value_cbb;
  CBB type_cbb;
  CBB attribute_type_and_value_cbb;
  X509NameAttribute *type_and_value;
  iterator __end2;
  iterator __begin2;
  RelativeDistinguishedName *__range2;
  CBB rdn_cbb;
  RelativeDistinguishedName type_and_values;
  Parser rdn_parser;
  undefined1 local_88 [8];
  ScopedCBB cbb;
  undefined1 local_48 [8];
  Parser rdn_sequence_parser;
  CertErrors *errors_local;
  string *normalized_rdn_sequence_local;
  Input name_rdn_sequence_local;
  
  rdn_sequence_parser.advance_len_ = (size_t)normalized_rdn_sequence;
  if (normalized_rdn_sequence == (string *)0x0) {
    abort();
  }
  input.data_.size_ = (size_t)name_rdn_sequence.data_.data_;
  input.data_.data_ = (uchar *)this;
  cbb.ctx_.u._24_8_ = this;
  der::Parser::Parser((Parser *)local_48,input);
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_88);
  pcVar4 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                     ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_88);
  iVar3 = CBB_init(pcVar4,0);
  if (iVar3 == 0) {
    name_rdn_sequence_local.data_.size_._7_1_ = 0;
  }
  else {
    do {
      bVar2 = der::Parser::HasMore((Parser *)local_48);
      if (!bVar2) {
        pcVar4 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                           ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_88);
        puVar5 = CBB_data(pcVar4);
        pcVar4 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                           ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_88);
        puVar6 = CBB_data(pcVar4);
        pcVar4 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                           ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_88);
        sVar7 = CBB_len(pcVar4);
        ::std::__cxx11::string::assign<unsigned_char_const*,void>
                  ((string *)name_rdn_sequence.data_.size_,puVar5,puVar6 + sVar7);
        name_rdn_sequence_local.data_.size_._7_1_ = 1;
        break;
      }
      der::Parser::Parser((Parser *)
                          &type_and_values.
                           super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar2 = der::Parser::ReadConstructed
                        ((Parser *)local_48,0x20000011,
                         (Parser *)
                         &type_and_values.
                          super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar2) {
        name_rdn_sequence_local.data_.size_._7_1_ = 0;
        break;
      }
      pvVar1 = (vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_> *)
               ((long)&rdn_cbb.u + 0x18);
      ::std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>::vector
                (pvVar1);
      bVar2 = ReadRdn((Parser *)
                      &type_and_values.
                       super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar1);
      if (bVar2) {
        pcVar4 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                           ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_88);
        iVar3 = CBB_add_asn1(pcVar4,(CBB *)&__range2,0x20000011);
        if (iVar3 == 0) {
          name_rdn_sequence_local.data_.size_._7_1_ = 0;
          bVar2 = true;
        }
        else {
          pvVar1 = (vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_> *)
                   ((long)&rdn_cbb.u + 0x18);
          __end2 = ::std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                   ::begin(pvVar1);
          type_and_value =
               (X509NameAttribute *)
               ::std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>::end
                         (pvVar1);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end2,(__normal_iterator<bssl::X509NameAttribute_*,_std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>
                                             *)&type_and_value), bVar2) {
            this_00 = __gnu_cxx::
                      __normal_iterator<bssl::X509NameAttribute_*,_std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>
                      ::operator*(&__end2);
            iVar3 = CBB_add_asn1((CBB *)&__range2,(CBB *)((long)&type_cbb.u + 0x18),0x20000010);
            if (iVar3 == 0) {
              name_rdn_sequence_local.data_.size_._7_1_ = 0;
              bVar2 = true;
              goto LAB_0061e24c;
            }
            iVar3 = CBB_add_asn1((CBB *)((long)&type_cbb.u + 0x18),
                                 (CBB *)((long)&value_cbb.u + 0x18),6);
            if (iVar3 == 0) {
LAB_0061df57:
              name_rdn_sequence_local.data_.size_._7_1_ = 0;
              bVar2 = true;
              goto LAB_0061e24c;
            }
            puVar5 = der::Input::data(&this_00->type);
            sVar7 = der::Input::size(&this_00->type);
            iVar3 = CBB_add_bytes((CBB *)((long)&value_cbb.u + 0x18),puVar5,sVar7);
            if (iVar3 == 0) goto LAB_0061df57;
            bVar2 = anon_unknown_1::IsNormalizableDirectoryString(this_00->value_tag);
            if (!bVar2) {
              iVar3 = CBB_add_asn1((CBB *)((long)&type_cbb.u + 0x18),
                                   (CBB *)((long)&normalized_value.field_2 + 8),this_00->value_tag);
              if (iVar3 != 0) {
                puVar5 = der::Input::data(&this_00->value);
                sVar7 = der::Input::size(&this_00->value);
                iVar3 = CBB_add_bytes((CBB *)((long)&normalized_value.field_2 + 8),puVar5,sVar7);
                if (iVar3 != 0) goto LAB_0061e1a0;
              }
              name_rdn_sequence_local.data_.size_._7_1_ = 0;
              bVar2 = true;
              goto LAB_0061e24c;
            }
            ::std::__cxx11::string::string((string *)local_1c8);
            bVar2 = anon_unknown_1::NormalizeValue
                              (*this_00,(string *)local_1c8,
                               (CertErrors *)rdn_sequence_parser.advance_len_);
            if (bVar2) {
              iVar3 = CBB_add_asn1((CBB *)((long)&type_cbb.u + 0x18),
                                   (CBB *)((long)&normalized_value.field_2 + 8),0xc);
              if (iVar3 != 0) {
                puVar5 = (uint8_t *)::std::__cxx11::string::data();
                sVar7 = ::std::__cxx11::string::size();
                iVar3 = CBB_add_bytes((CBB *)((long)&normalized_value.field_2 + 8),puVar5,sVar7);
                if (iVar3 != 0) {
                  bVar2 = false;
                  goto LAB_0061e0db;
                }
              }
              name_rdn_sequence_local.data_.size_._7_1_ = 0;
              bVar2 = true;
            }
            else {
              name_rdn_sequence_local.data_.size_._7_1_ = 0;
              bVar2 = true;
            }
LAB_0061e0db:
            ::std::__cxx11::string::~string((string *)local_1c8);
            if (bVar2) goto LAB_0061e24c;
LAB_0061e1a0:
            iVar3 = CBB_flush((CBB *)&__range2);
            if (iVar3 == 0) {
              name_rdn_sequence_local.data_.size_._7_1_ = 0;
              bVar2 = true;
              goto LAB_0061e24c;
            }
            __gnu_cxx::
            __normal_iterator<bssl::X509NameAttribute_*,_std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>
            ::operator++(&__end2);
          }
          iVar3 = CBB_flush_asn1_set_of((CBB *)&__range2);
          if (iVar3 != 0) {
            pcVar4 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                               ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_88);
            iVar3 = CBB_flush(pcVar4);
            if (iVar3 != 0) {
              bVar2 = false;
              goto LAB_0061e24c;
            }
          }
          name_rdn_sequence_local.data_.size_._7_1_ = 0;
          bVar2 = true;
        }
      }
      else {
        name_rdn_sequence_local.data_.size_._7_1_ = 0;
        bVar2 = true;
      }
LAB_0061e24c:
      ::std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>::~vector
                ((vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_> *)
                 ((long)&rdn_cbb.u + 0x18));
    } while (!bVar2);
  }
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_88);
  return (bool)(name_rdn_sequence_local.data_.size_._7_1_ & 1);
}

Assistant:

bool NormalizeName(der::Input name_rdn_sequence,
                   std::string *normalized_rdn_sequence, CertErrors *errors) {
  BSSL_CHECK(errors);

  // RFC 5280 section 4.1.2.4
  // RDNSequence ::= SEQUENCE OF RelativeDistinguishedName
  der::Parser rdn_sequence_parser(name_rdn_sequence);

  bssl::ScopedCBB cbb;
  if (!CBB_init(cbb.get(), 0)) {
    return false;
  }

  while (rdn_sequence_parser.HasMore()) {
    // RelativeDistinguishedName ::= SET SIZE (1..MAX) OF AttributeTypeAndValue
    der::Parser rdn_parser;
    if (!rdn_sequence_parser.ReadConstructed(CBS_ASN1_SET, &rdn_parser)) {
      return false;
    }
    RelativeDistinguishedName type_and_values;
    if (!ReadRdn(&rdn_parser, &type_and_values)) {
      return false;
    }

    CBB rdn_cbb;
    if (!CBB_add_asn1(cbb.get(), &rdn_cbb, CBS_ASN1_SET)) {
      return false;
    }

    for (const auto &type_and_value : type_and_values) {
      // AttributeTypeAndValue ::= SEQUENCE {
      //   type     AttributeType,
      //   value    AttributeValue }
      CBB attribute_type_and_value_cbb, type_cbb, value_cbb;
      if (!CBB_add_asn1(&rdn_cbb, &attribute_type_and_value_cbb,
                        CBS_ASN1_SEQUENCE)) {
        return false;
      }

      // AttributeType ::= OBJECT IDENTIFIER
      if (!CBB_add_asn1(&attribute_type_and_value_cbb, &type_cbb,
                        CBS_ASN1_OBJECT) ||
          !CBB_add_bytes(&type_cbb, type_and_value.type.data(),
                         type_and_value.type.size())) {
        return false;
      }

      // AttributeValue ::= ANY -- DEFINED BY AttributeType
      if (IsNormalizableDirectoryString(type_and_value.value_tag)) {
        std::string normalized_value;
        if (!NormalizeValue(type_and_value, &normalized_value, errors)) {
          return false;
        }
        if (!CBB_add_asn1(&attribute_type_and_value_cbb, &value_cbb,
                          CBS_ASN1_UTF8STRING) ||
            !CBB_add_bytes(
                &value_cbb,
                reinterpret_cast<const uint8_t *>(normalized_value.data()),
                normalized_value.size())) {
          return false;
        }
      } else {
        if (!CBB_add_asn1(&attribute_type_and_value_cbb, &value_cbb,
                          type_and_value.value_tag) ||
            !CBB_add_bytes(&value_cbb, type_and_value.value.data(),
                           type_and_value.value.size())) {
          return false;
        }
      }

      if (!CBB_flush(&rdn_cbb)) {
        return false;
      }
    }

    // Ensure the encoded AttributeTypeAndValue values in the SET OF are sorted.
    if (!CBB_flush_asn1_set_of(&rdn_cbb) || !CBB_flush(cbb.get())) {
      return false;
    }
  }

  normalized_rdn_sequence->assign(CBB_data(cbb.get()),
                                  CBB_data(cbb.get()) + CBB_len(cbb.get()));
  return true;
}